

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
          *f)

{
  counting_iterator<char> __first;
  counting_iterator<char> __first_00;
  counting_iterator<char> __first_01;
  uint uVar1;
  alignment aVar2;
  counting_iterator<char> *pcVar3;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  *in_RDX;
  align_spec *in_RSI;
  counting_iterator<char> cVar4;
  size_t left_padding;
  size_t padding;
  char_type fill;
  counting_iterator<char> *it;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_fffffffffffffec8;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_fffffffffffffed0;
  ulong local_128;
  char *in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff11;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff21;
  counting_iterator<char> *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  
  uVar1 = align_spec::width(in_RSI);
  local_128 = basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
              ::
              padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
              ::size(in_RDX);
  if (uVar1 != 0) {
    local_128 = basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                ::
                padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
                ::width(in_RDX);
  }
  if (local_128 < uVar1) {
    pcVar3 = basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
             ::reserve(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    align_spec::fill(in_RSI);
    aVar2 = align_spec::align(in_RSI);
    if (aVar2 == ALIGN_RIGHT) {
      __first.blackhole_ = in_stack_ffffffffffffff20;
      __first.count_ = in_stack_ffffffffffffff18;
      __first._9_7_ = in_stack_ffffffffffffff21;
      cVar4 = std::fill_n<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                        (__first,CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff08);
      pcVar3->count_ = cVar4.count_;
      pcVar3->blackhole_ = cVar4.blackhole_;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
                    *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
    }
    else {
      aVar2 = align_spec::align(in_RSI);
      if (aVar2 == ALIGN_CENTER) {
        __first_00.blackhole_ = in_stack_ffffffffffffff20;
        __first_00.count_ = in_stack_ffffffffffffff18;
        __first_00._9_7_ = in_stack_ffffffffffffff21;
        cVar4 = std::fill_n<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                          (__first_00,CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08);
        pcVar3->blackhole_ = cVar4.blackhole_;
        pcVar3->count_ = cVar4.count_;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
                      *)CONCAT71(in_stack_ffffffffffffff51,cVar4.blackhole_),
                     (counting_iterator<char> *)cVar4.count_);
        __first_01.blackhole_ = in_stack_ffffffffffffff20;
        __first_01.count_ = in_stack_ffffffffffffff18;
        __first_01._9_7_ = in_stack_ffffffffffffff21;
        cVar4 = std::fill_n<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                          (__first_01,CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08);
        pcVar3->count_ = cVar4.count_;
        pcVar3->blackhole_ = cVar4.blackhole_;
      }
      else {
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
                      *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
        cVar4.blackhole_ = in_stack_ffffffffffffff20;
        cVar4.count_ = in_stack_ffffffffffffff18;
        cVar4._9_7_ = in_stack_ffffffffffffff21;
        cVar4 = std::fill_n<fmt::v5::internal::counting_iterator<char>,unsigned_long,char>
                          (cVar4,CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08);
        pcVar3->count_ = cVar4.count_;
        pcVar3->blackhole_ = cVar4.blackhole_;
      }
    }
  }
  else {
    basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::reserve
              ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                *)in_RDX,in_stack_fffffffffffffec8);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
                  *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }